

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Dtc_ManComputeCuts(Gia_Man_t *p,Vec_Int_t **pvCutsXor2,Vec_Int_t **pvCutsXor,
                       Vec_Int_t **pvCutsMaj,int fVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vCuts_00;
  Vec_Int_t *vCutsXor2_00;
  Vec_Int_t *vCutsXor_00;
  Vec_Int_t *vCutsMaj_00;
  Vec_Int_t *p_00;
  int *pList0_00;
  int *pList1_00;
  bool bVar5;
  Vec_Int_t *vCuts;
  Vec_Int_t *vCutsMaj;
  Vec_Int_t *vCutsXor;
  Vec_Int_t *vCutsXor2;
  Vec_Int_t *vTemp;
  int nCuts;
  int i;
  int *pList1;
  int *pList0;
  Gia_Obj_t *pObj;
  int fVerbose_local;
  Vec_Int_t **pvCutsMaj_local;
  Vec_Int_t **pvCutsXor_local;
  Vec_Int_t **pvCutsXor2_local;
  Gia_Man_t *p_local;
  
  vTemp._0_4_ = 0;
  vCuts_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManAndNum(p);
  vCutsXor2_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  vCutsXor_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  vCutsMaj_00 = Vec_IntAlloc(iVar1);
  iVar1 = Gia_ManAndNum(p);
  p_00 = Vec_IntAlloc(iVar1 * 0x1e);
  iVar1 = Gia_ManObjNum(p);
  Vec_IntFill(p_00,iVar1,0);
  Gia_ManCleanValue(p);
  vTemp._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar5 = false;
    if (vTemp._4_4_ < iVar1) {
      pList0 = (int *)Gia_ManCi(p,vTemp._4_4_);
      bVar5 = (Gia_Obj_t *)pList0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pList0);
    iVar3 = Vec_IntSize(p_00);
    Vec_IntWriteEntry(p_00,iVar1,iVar3);
    Vec_IntPush(p_00,1);
    Vec_IntPush(p_00,1);
    iVar1 = Gia_ObjId(p,(Gia_Obj_t *)pList0);
    Vec_IntPush(p_00,iVar1);
    vTemp._4_4_ = vTemp._4_4_ + 1;
  }
  vTemp._4_4_ = 0;
  while( true ) {
    bVar5 = false;
    if (vTemp._4_4_ < p->nObjs) {
      pList0 = (int *)Gia_ManObj(p,vTemp._4_4_);
      bVar5 = (Gia_Obj_t *)pList0 != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    iVar1 = Gia_ObjIsAnd((Gia_Obj_t *)pList0);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFaninId0((Gia_Obj_t *)pList0,vTemp._4_4_);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      pList0_00 = Vec_IntEntryP(p_00,iVar1);
      iVar1 = Gia_ObjFaninId1((Gia_Obj_t *)pList0,vTemp._4_4_);
      iVar1 = Vec_IntEntry(p_00,iVar1);
      pList1_00 = Vec_IntEntryP(p_00,iVar1);
      Dtc_ManCutMerge(p,vTemp._4_4_,pList0_00,pList1_00,vCuts_00,vCutsXor2_00,vCutsXor_00,
                      vCutsMaj_00);
      iVar1 = Vec_IntSize(p_00);
      Vec_IntWriteEntry(p_00,vTemp._4_4_,iVar1);
      Vec_IntAppend(p_00,vCuts_00);
      iVar1 = Vec_IntEntry(vCuts_00,0);
      vTemp._0_4_ = iVar1 + (uint)vTemp;
    }
    vTemp._4_4_ = vTemp._4_4_ + 1;
  }
  if (fVerbose != 0) {
    uVar2 = Gia_ManAndNum(p);
    iVar1 = Gia_ManAndNum(p);
    iVar3 = Vec_IntSize(p_00);
    iVar4 = Gia_ManAndNum(p);
    printf("Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n",
           ((double)(int)(uint)vTemp * 1.0) / (double)iVar1,((double)iVar3 * 1.0) / (double)iVar4,
           (ulong)uVar2,(ulong)(uint)vTemp);
  }
  Vec_IntFree(vCuts_00);
  Vec_IntFree(p_00);
  if (pvCutsXor2 == (Vec_Int_t **)0x0) {
    Vec_IntFree(vCutsXor2_00);
  }
  else {
    *pvCutsXor2 = vCutsXor2_00;
  }
  *pvCutsXor = vCutsXor_00;
  *pvCutsMaj = vCutsMaj_00;
  return;
}

Assistant:

void Dtc_ManComputeCuts( Gia_Man_t * p, Vec_Int_t ** pvCutsXor2, Vec_Int_t ** pvCutsXor, Vec_Int_t ** pvCutsMaj, int fVerbose )
{
    Gia_Obj_t * pObj; 
    int * pList0, * pList1, i, nCuts = 0;
    Vec_Int_t * vTemp = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCutsXor2 = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsXor = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCutsMaj = Vec_IntAlloc( Gia_ManAndNum(p) );
    Vec_Int_t * vCuts = Vec_IntAlloc( 30 * Gia_ManAndNum(p) );
    Vec_IntFill( vCuts, Gia_ManObjNum(p), 0 );
    Gia_ManCleanValue( p );
    Gia_ManForEachCi( p, pObj, i )
    {
        Vec_IntWriteEntry( vCuts, Gia_ObjId(p, pObj), Vec_IntSize(vCuts) );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, 1 );
        Vec_IntPush( vCuts, Gia_ObjId(p, pObj) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pList0 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId0(pObj, i)) );
        pList1 = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, Gia_ObjFaninId1(pObj, i)) );
        Dtc_ManCutMerge( p, i, pList0, pList1, vTemp, vCutsXor2, vCutsXor, vCutsMaj );
        Vec_IntWriteEntry( vCuts, i, Vec_IntSize(vCuts) );
        Vec_IntAppend( vCuts, vTemp );
        nCuts += Vec_IntEntry( vTemp, 0 );
    }
    if ( fVerbose )
        printf( "Nodes = %d.  Cuts = %d.  Cuts/Node = %.2f.  Ints/Node = %.2f.\n", 
            Gia_ManAndNum(p), nCuts, 1.0*nCuts/Gia_ManAndNum(p), 1.0*Vec_IntSize(vCuts)/Gia_ManAndNum(p) );
    Vec_IntFree( vTemp );
    Vec_IntFree( vCuts );
    if ( pvCutsXor2 )
        *pvCutsXor2 = vCutsXor2;
    else
        Vec_IntFree( vCutsXor2 );
    *pvCutsXor = vCutsXor;
    *pvCutsMaj = vCutsMaj;
}